

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int debug_getupvalue(lua_State *L,int get)

{
  int32_t n;
  char *pcVar1;
  
  n = lj_lib_checkint(L,2);
  lj_lib_checkfunc(L,1);
  if (get == 0) {
    pcVar1 = lua_setupvalue(L,1,n);
    if (pcVar1 != (char *)0x0) {
      lua_pushstring(L,pcVar1);
      return 1;
    }
  }
  else {
    pcVar1 = lua_getupvalue(L,1,n);
    if (pcVar1 != (char *)0x0) {
      lua_pushstring(L,pcVar1);
      *L->top = L->top[-2];
      L->top = L->top + 1;
      return 2;
    }
  }
  return 0;
}

Assistant:

static int debug_getupvalue(lua_State *L, int get)
{
  int32_t n = lj_lib_checkint(L, 2);
  const char *name;
  lj_lib_checkfunc(L, 1);
  name = get ? lua_getupvalue(L, 1, n) : lua_setupvalue(L, 1, n);
  if (name) {
    lua_pushstring(L, name);
    if (!get) return 1;
    copyTV(L, L->top, L->top-2);
    L->top++;
    return 2;
  }
  return 0;
}